

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool art_iterator_erase(art_iterator_t *iterator,art_val_t *erased_val)

{
  art_val_t *paVar1;
  art_t *paVar2;
  ulong uVar3;
  _Bool _Var4;
  undefined8 in_RAX;
  ulong uVar5;
  art_ref_t new_child;
  art_typecode_t typecode;
  uint64_t *puVar6;
  ulong uVar7;
  long lVar8;
  uint64_t uVar9;
  long lVar10;
  art_key_chunk_t initial_key [6];
  undefined4 local_38;
  undefined4 local_34;
  
  paVar1 = iterator->value;
  if (paVar1 == (art_val_t *)0x0) goto LAB_001063cc;
  local_34._2_2_ = (undefined2)((ulong)in_RAX >> 0x30);
  _local_38 = CONCAT44(CONCAT22(local_34._2_2_,*(undefined2 *)(iterator->key + 4)),
                       *(undefined4 *)iterator->key);
  if (erased_val != (art_val_t *)0x0) {
    *erased_val = *paVar1;
  }
  paVar2 = iterator->art;
  uVar3 = iterator->frames[iterator->frame].ref;
  uVar5 = uVar3 & 0xff;
  uVar7 = (ulong)(uint)((int)uVar5 * 8);
  lVar8 = *(long *)((long)paVar2->nodes + uVar7);
  puVar6 = (uint64_t *)((uVar3 >> 0x10) * *(long *)((long)ART_NODE_SIZES + uVar7) + lVar8);
  switch((uint)uVar3 & 0xff) {
  case 1:
    uVar9 = (long)puVar6 - lVar8 >> 4;
    goto LAB_001062b5;
  case 2:
    lVar10 = (long)puVar6 - lVar8 >> 4;
    lVar8 = -0x5555555555555555;
    break;
  case 3:
    lVar10 = (long)puVar6 - lVar8 >> 3;
    lVar8 = -0x79435e50d79435e5;
    break;
  case 4:
    lVar10 = (long)puVar6 - lVar8 >> 4;
    lVar8 = -0x7063e7063e7063e7;
    break;
  case 5:
    lVar10 = (long)puVar6 - lVar8 >> 3;
    lVar8 = -0xff00ff00ff00ff;
    break;
  default:
    uVar9 = 0;
    goto LAB_001062b5;
  }
  uVar9 = lVar8 * lVar10;
LAB_001062b5:
  if ((byte)((char)uVar3 - 1U) < 5) {
    *puVar6 = paVar2->first_free[uVar5];
  }
  paVar2->first_free[uVar5] = uVar9;
  _Var4 = art_iterator_up(iterator);
  if (_Var4) {
    uVar3 = iterator->frames[iterator->frame].ref;
    uVar5 = (ulong)(((uint)uVar3 & 0xff) * 8);
    lVar8 = *(long *)((long)iterator->art->nodes + uVar5);
    lVar10 = (uVar3 >> 0x10) * *(long *)((long)ART_NODE_SIZES + uVar5);
    new_child = art_node_erase(iterator->art,(art_inner_node_t *)(lVar8 + lVar10),
                               (art_typecode_t)uVar3,
                               iterator->key
                               [(ulong)*(byte *)(lVar8 + lVar10) + (ulong)iterator->depth]);
    if (new_child != uVar3) {
      iterator->frames[iterator->frame].ref = new_child;
      _Var4 = art_iterator_up(iterator);
      if (_Var4) {
        uVar3 = iterator->frames[iterator->frame].ref;
        uVar5 = (ulong)(((uint)uVar3 & 0xff) * 8);
        lVar8 = *(long *)((long)iterator->art->nodes + uVar5);
        lVar10 = (uVar3 >> 0x10) * *(long *)((long)ART_NODE_SIZES + uVar5);
        art_replace((art_inner_node_t *)(lVar8 + lVar10),(art_typecode_t)uVar3,
                    iterator->key[(ulong)*(byte *)(lVar8 + lVar10) + (ulong)iterator->depth],
                    new_child);
      }
      else {
        iterator->art->root = new_child;
      }
    }
    iterator->depth = '\0';
    iterator->frame = '\0';
    art_node_iterator_lower_bound(iterator->art->root,iterator,(art_key_chunk_t *)&local_38);
  }
  else {
    iterator->art->root = 0;
    iterator->key[4] = '\0';
    iterator->key[5] = '\0';
    iterator->key[0] = '\0';
    iterator->key[1] = '\0';
    iterator->key[2] = '\0';
    iterator->key[3] = '\0';
    iterator->value = (art_val_t *)0x0;
  }
LAB_001063cc:
  return paVar1 != (art_val_t *)0x0;
}

Assistant:

bool art_iterator_erase(art_iterator_t *iterator, art_val_t *erased_val) {
    art_val_t erased_val_local;
    if (erased_val == NULL) {
        erased_val = &erased_val_local;
    }
    if (iterator->value == NULL) {
        return false;
    }
    art_key_chunk_t initial_key[ART_KEY_BYTES];
    memcpy(initial_key, iterator->key, ART_KEY_BYTES);

    *erased_val = *iterator->value;
    // Erase the leaf.
    art_node_free(iterator->art, art_iterator_node(iterator),
                  art_ref_typecode(art_iterator_ref(iterator)));
    bool went_up = art_iterator_up(iterator);
    if (!went_up) {
        // We're erasing the root.
        iterator->art->root = CROARING_ART_NULL_REF;
        art_iterator_invalid_loc(iterator);
        return true;
    }

    // Erase the leaf in its parent.
    art_ref_t parent_ref = art_iterator_ref(iterator);
    art_inner_node_t *parent_node =
        (art_inner_node_t *)art_iterator_node(iterator);
    art_key_chunk_t key_chunk_in_parent =
        iterator->key[iterator->depth + parent_node->prefix_size];
    art_ref_t new_parent_ref =
        art_node_erase(iterator->art, parent_node, art_ref_typecode(parent_ref),
                       key_chunk_in_parent);

    if (new_parent_ref != parent_ref) {
        // Replace the pointer to the inner node we erased from in its
        // parent (it may be a leaf now).
        iterator->frames[iterator->frame].ref = new_parent_ref;
        went_up = art_iterator_up(iterator);
        if (went_up) {
            art_ref_t grandparent_ref = art_iterator_ref(iterator);
            art_inner_node_t *grandparent_node =
                (art_inner_node_t *)art_iterator_node(iterator);
            art_key_chunk_t key_chunk_in_grandparent =
                iterator->key[iterator->depth + grandparent_node->prefix_size];
            art_replace(grandparent_node, art_ref_typecode(grandparent_ref),
                        key_chunk_in_grandparent, new_parent_ref);
        } else {
            // We were already at the rootmost node.
            iterator->art->root = new_parent_ref;
        }
    }

    iterator->frame = 0;
    iterator->depth = 0;
    // Do a lower bound search for the initial key, which will find the
    // first greater key if it exists. This can likely be mildly faster if
    // we instead start from the current position.
    art_node_iterator_lower_bound(iterator->art->root, iterator, initial_key);
    return true;
}